

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

NullableValue<kj::HttpServer::SuspendedRequest> * __thiscall
kj::_::NullableValue<kj::HttpServer::SuspendedRequest>::operator=
          (NullableValue<kj::HttpServer::SuspendedRequest> *this,
          NullableValue<kj::HttpServer::SuspendedRequest> *other)

{
  uint uVar1;
  uchar *puVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
      HttpHeaders::~HttpHeaders(&(this->field_1).value.headers);
      if ((this->field_1).value.method.tag - 1 < 2) {
        (this->field_1).value.method.tag = 0;
      }
      puVar2 = (this->field_1).value.buffer.ptr;
      if (puVar2 != (uchar *)0x0) {
        sVar3 = (this->field_1).value.buffer.size_;
        (this->field_1).value.buffer.ptr = (uchar *)0x0;
        (this->field_1).value.buffer.size_ = 0;
        pAVar4 = (this->field_1).value.buffer.disposer;
        (**pAVar4->_vptr_ArrayDisposer)(pAVar4,puVar2,1,sVar3,sVar3,0);
      }
    }
    if (other->isSet == true) {
      (this->field_1).value.buffer.ptr = (other->field_1).value.buffer.ptr;
      (this->field_1).value.buffer.size_ = (other->field_1).value.buffer.size_;
      (this->field_1).value.buffer.disposer = (other->field_1).value.buffer.disposer;
      (other->field_1).value.buffer.ptr = (uchar *)0x0;
      (other->field_1).value.buffer.size_ = 0;
      sVar3 = (other->field_1).value.leftover.size_;
      (this->field_1).value.leftover.ptr = (other->field_1).value.leftover.ptr;
      (this->field_1).value.leftover.size_ = sVar3;
      uVar1 = (other->field_1).value.method.tag;
      (this->field_1).value.method.tag = uVar1;
      if (uVar1 == 1) {
        *(undefined4 *)&(this->field_1).value.method.field_1 =
             *(undefined4 *)&(other->field_1).value.method.field_1;
      }
      sVar3 = (other->field_1).value.url.content.size_;
      (this->field_1).value.url.content.ptr = (other->field_1).value.url.content.ptr;
      (this->field_1).value.url.content.size_ = sVar3;
      HttpHeaders::HttpHeaders(&(this->field_1).value.headers,&(other->field_1).value.headers);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }